

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  size_t sVar1;
  pointer piVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  pointer pdVar7;
  double *pdVar8;
  bool bVar9;
  long lVar10;
  double *pdVar11;
  pointer pdVar12;
  uint uVar13;
  size_t sVar14;
  long lVar15;
  pointer pdVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  Data2D<double> vals;
  vector<double,_std::allocator<double>_> norm;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> global_to_pnts;
  Data2D<int> dagUp;
  SplitDirections split;
  uint local_198;
  double *local_180;
  allocator_type local_161;
  pointer local_160;
  double *local_158;
  ulong local_150;
  pointer local_148;
  ulong local_140;
  pointer local_138;
  ulong local_130;
  long local_128;
  vector<double,_std::allocator<double>_> local_120;
  pointer local_108;
  ulong local_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  Data2D<int> local_b0;
  SplitDirections local_88;
  long local_58;
  pointer local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  pdVar16 = (pointer)(long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar14 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_b0.stride = CONCAT44(local_b0.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_158 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_88.job_directions,sVar14 * (long)pdVar16,(value_type_conflict3 *)&local_b0,
             (allocator_type *)&local_130);
  pdVar8 = (double *)
           local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = local_158;
  __return_storage_ptr__->stride = sVar14;
  __return_storage_ptr__->num_strips = (size_t)pdVar16;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_160 = pdVar16;
    getNormalization(&local_f8,this);
    pdVar16 = local_160;
    uVar17 = 1;
    if (output == -1) {
      uVar17 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_150 = (ulong)(int)uVar17;
    local_138 = (pointer)0x0;
    local_180 = (double *)0x0;
    if (pdVar4 == (double *)0x0) {
      local_b0.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_88,local_150 * (long)local_160,
                 (value_type_conflict2 *)&local_b0,(allocator_type *)&local_130);
      local_138 = local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_180 = (double *)
                  local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pdVar4 = (double *)
               local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_158 = pdVar4;
    if (criteria < refine_direction_selective) {
      if (0 < (int)pdVar16) {
        sVar1 = (this->surpluses).stride;
        pdVar7 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar16 = (pointer)0x0;
        pdVar11 = pdVar4;
        pdVar12 = pdVar7;
        do {
          if (output == -1) {
            lVar10 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar10) {
              bVar9 = true;
              lVar6 = 0;
              do {
                if (bVar9) {
                  bVar9 = (ABS(pdVar12[lVar6]) * pdVar11[lVar6]) /
                          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6] <= tolerance;
                }
                else {
                  bVar9 = false;
                }
                lVar6 = lVar6 + 1;
              } while (lVar10 != lVar6);
              goto LAB_001a1d8f;
            }
          }
          else {
            bVar9 = (ABS(pdVar7[sVar1 * (long)pdVar16 + (long)output]) *
                    pdVar4[(long)pdVar16 * local_150]) /
                    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[output] <= tolerance;
LAB_001a1d8f:
            if ((!bVar9) &&
               (lVar10 = (long)(this->super_BaseCanonicalGrid).num_dimensions, 0 < lVar10)) {
              lVar6 = 0;
              do {
                *(undefined4 *)((long)pdVar8 + lVar6) = 1;
                lVar6 = lVar6 + 4;
              } while (lVar10 * 4 != lVar6);
            }
          }
          pdVar16 = (pointer)((long)pdVar16 + 1);
          pdVar12 = pdVar12 + sVar1;
          pdVar11 = pdVar11 + local_150;
          pdVar8 = (double *)((long)pdVar8 + sVar14 * 4);
        } while (pdVar16 != local_160);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>(&local_b0,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_88,mset);
      iVar3 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_88);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_c8,(size_type)pdVar16,(allocator_type *)&local_130);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e0,(long)iVar3,(allocator_type *)&local_130);
      if (0 < (int)((ulong)((long)local_88.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_40 = (long)output;
        local_38 = __return_storage_ptr__->stride;
        local_50 = (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar10 = 0;
        local_58 = local_40 * 8;
        do {
          lVar6 = (long)*(int *)((long)local_88.job_directions.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar10 * 4);
          local_148 = local_88.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar10].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          uVar20 = (ulong)((long)local_88.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)local_148) >> 2;
          local_130 = local_150;
          uVar18 = (uint)uVar20;
          local_128 = (long)(int)uVar18;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_120,local_128 * local_150,&local_161);
          piVar2 = local_148;
          local_100 = uVar20;
          local_48 = lVar10;
          if (output == -1) {
            if ((int)uVar18 < 1) goto LAB_001a20a5;
            uVar20 = 0;
            local_198 = 0;
            do {
              lVar10 = (long)(this->super_BaseCanonicalGrid).num_outputs;
              if (0 < lVar10) {
                memmove(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + local_130 * uVar20,
                        (this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)piVar2[uVar20] * (this->super_BaseCanonicalGrid).values.num_outputs,
                        lVar10 << 3);
              }
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[piVar2[uVar20]] = (int)uVar20;
              uVar19 = (this->super_BaseCanonicalGrid).points.indexes.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)piVar2[uVar20] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + lVar6];
              uVar13 = uVar19;
              if ((1 < uVar19) && (uVar13 = 1, uVar19 != 2)) {
                uVar19 = uVar19 - 1;
                do {
                  uVar19 = (int)uVar19 >> 1;
                  uVar13 = uVar13 + 1;
                } while (1 < uVar19);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar20] = uVar13;
              if ((int)local_198 <= (int)uVar13) {
                local_198 = uVar13;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != (uVar18 & 0x7fffffff));
          }
          else if ((int)uVar18 < 1) {
LAB_001a20a5:
            local_198 = 0;
          }
          else {
            sVar14 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            sVar1 = (this->super_BaseCanonicalGrid).values.num_outputs;
            pdVar7 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar2 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar20 = 0;
            local_198 = 0;
            do {
              iVar3 = local_148[uVar20];
              local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_130 * uVar20] =
                   *(double *)((long)pdVar7 + sVar1 * (long)iVar3 * 8 + local_58);
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar3] = (int)uVar20;
              uVar19 = piVar2[lVar6 + (long)local_148[uVar20] * sVar14];
              uVar13 = uVar19;
              if ((1 < uVar19) && (uVar13 = 1, uVar19 != 2)) {
                uVar19 = uVar19 - 1;
                do {
                  uVar19 = (int)uVar19 >> 1;
                  uVar13 = uVar13 + 1;
                } while (1 < uVar19);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar20] = uVar13;
              if ((int)local_198 <= (int)uVar13) {
                local_198 = uVar13;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != (uVar18 & 0x7fffffff));
          }
          uVar18 = (uint)local_100;
          if (0 < (int)local_198) {
            local_108 = (pointer)(ulong)(uVar18 & 0x7fffffff);
            local_140 = 1;
            do {
              if (0 < (int)local_100) {
                lVar10 = 0;
                pdVar7 = (pointer)0x0;
                do {
                  piVar2 = local_148;
                  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pdVar7] == (int)local_140) {
                    local_160 = (pointer)RuleLocal::getNode<(TasGrid::RuleLocal::erule)1>
                                                   ((this->super_BaseCanonicalGrid).points.indexes.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start
                                                    [(long)local_148[(long)pdVar7] *
                                                     (this->super_BaseCanonicalGrid).points.
                                                     num_dimensions + lVar6]);
                    pdVar12 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    iVar3 = local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(long)piVar2[(long)pdVar7] * local_b0.stride + lVar6];
                    if (iVar3 != -1) {
                      lVar21 = local_130 * lVar10;
                      do {
                        lVar15 = (long)iVar3;
                        dVar22 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)1>
                                           (this->order,
                                            (this->super_BaseCanonicalGrid).points.indexes.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start
                                            [(this->super_BaseCanonicalGrid).points.num_dimensions *
                                             lVar15 + lVar6],(double)local_160);
                        if (0 < (int)uVar17) {
                          iVar3 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar15];
                          uVar20 = 0;
                          do {
                            *(double *)((long)pdVar12 + uVar20 * 8 + lVar21) =
                                 local_120.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(long)iVar3 * local_130 + uVar20] * -dVar22 +
                                 *(double *)((long)pdVar12 + uVar20 * 8 + lVar21);
                            uVar20 = uVar20 + 1;
                          } while (uVar17 != uVar20);
                        }
                        iVar3 = local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar15 * local_b0.stride + lVar6];
                      } while (iVar3 != -1);
                    }
                  }
                  pdVar7 = (pointer)((long)pdVar7 + 1);
                  lVar10 = lVar10 + 8;
                } while (pdVar7 != local_108);
              }
              uVar19 = (uint)local_140;
              local_140 = (ulong)(uVar19 + 1);
              uVar18 = (uint)local_100;
            } while (uVar19 != local_198);
          }
          if (0 < (int)uVar18) {
            sVar14 = (this->surpluses).stride;
            pdVar7 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_160 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            local_140 = local_130;
            local_108 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            uVar20 = 0;
            pdVar12 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              lVar21 = (long)local_148[uVar20];
              lVar10 = sVar14 * lVar21;
              if (output == -1) {
                lVar15 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                bVar9 = true;
                if (0 < lVar15) {
                  lVar5 = 0;
                  do {
                    if (bVar9 == false) {
                      bVar9 = false;
                    }
                    else {
                      dVar22 = (local_158 + lVar21 * local_150)[lVar5];
                      bVar9 = true;
                      if (tolerance <
                          (ABS(pdVar7[lVar10 + lVar5]) * dVar22) /
                          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar5]) {
                        bVar9 = (dVar22 * ABS(pdVar12[lVar5])) /
                                local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar5] <= tolerance;
                      }
                    }
                    lVar5 = lVar5 + 1;
                  } while (lVar15 != lVar5);
                }
              }
              else {
                dVar22 = local_158[lVar21 * local_150];
                bVar9 = true;
                if (tolerance <
                    (ABS(pdVar7[lVar10 + local_40]) * dVar22) /
                    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_40]) {
                  bVar9 = (dVar22 * ABS(local_120.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[local_130 * uVar20])) /
                          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_40] <= tolerance;
                }
              }
              local_50[lVar6 + lVar21 * local_38] = (uint)(bVar9 ^ 1);
              uVar20 = uVar20 + 1;
              pdVar12 = pdVar12 + local_130;
            } while (uVar20 != (uVar18 & 0x7fffffff));
          }
          if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar10 = local_48 + 1;
        } while (lVar10 < (int)((ulong)((long)local_88.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_88.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_88);
      if (local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_180 != (double *)0x0) {
      operator_delete(local_180,(long)local_138 - (long)local_180);
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}